

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O1

void __thiscall PerseusStationary::Load(PerseusStationary *this,string *filename)

{
  ValueFunctionPOMDPDiscrete local_48;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_28;
  
  AlphaVectorPlanning::ImportValueFunction(&local_48,filename);
  local_28.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)&(this->super_Perseus).field_0x90;
  local_28.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = *(pointer *)&(this->super_Perseus).field_0x98;
  local_28.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = *(pointer *)&(this->super_Perseus).field_0xa0;
  *(pointer *)&(this->super_Perseus).field_0x90 =
       local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)&(this->super_Perseus).field_0x98 =
       local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)&(this->super_Perseus).field_0xa0 =
       local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_28);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_48);
  return;
}

Assistant:

void PerseusStationary::Load(const std::string &filename)
{
    _m_valueFunction=ImportValueFunction(filename);
}